

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constraint.cpp
# Opt level: O0

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::Transformer::TransformConstraint
          (Transformer *this,PGConstraint *constraint,ColumnDefinition *column,idx_t index)

{
  char *pcVar1;
  bool bVar2;
  CompressionType compression_type;
  string *psVar3;
  undefined8 uVar4;
  CompressionType *pCVar5;
  string *msg;
  ColumnDefinition *in_RCX;
  long in_RDX;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_> in_RDI;
  idx_t in_R8;
  ColumnDefinition *in_stack_fffffffffffffd58;
  InvalidInputException *in_stack_fffffffffffffd60;
  allocator *paVar6;
  Transformer *in_stack_fffffffffffffd70;
  optional_ptr<duckdb_libpgquery::PGNode,_true> in_stack_fffffffffffffd78;
  LogicalIndex *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffda8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *default_value;
  ColumnDefinition *in_stack_fffffffffffffdb0;
  bool *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_fffffffffffffde8;
  ColumnDefinition *in_stack_fffffffffffffdf0;
  allocator local_1d1;
  string local_1d0 [32];
  optional_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b0 [2];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_150;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  local_148;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  allocator in_stack_fffffffffffffec7;
  Transformer *in_stack_fffffffffffffec8;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_118 [2];
  undefined1 local_101;
  string local_100 [32];
  PGConstraint *in_stack_ffffffffffffff20;
  optional_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_ffffffffffffff28;
  string local_b0 [32];
  LogicalIndex local_90 [4];
  undefined1 local_69;
  string local_68 [32];
  LogicalIndex local_48 [2];
  LogicalIndex local_38 [3];
  ColumnDefinition *local_20;
  long local_18;
  
  local_20 = in_RCX;
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 0:
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<std::default_delete<duckdb::Constraint>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    break;
  case 1:
    LogicalIndex::LogicalIndex(local_38,in_R8);
    make_uniq<duckdb::NotNullConstraint,duckdb::LogicalIndex>(in_stack_fffffffffffffd88);
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<duckdb::NotNullConstraint,std::default_delete<std::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>>>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>,_true>::
    ~unique_ptr((unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>,_true>
                 *)0x1a07f53);
    break;
  case 2:
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (&local_150,*(PGNode **)(in_RDX + 0x20));
    default_value = &local_148;
    TransformExpression(in_stack_fffffffffffffd70,in_stack_fffffffffffffd78);
    ColumnDefinition::SetDefaultValue(in_stack_fffffffffffffdb0,default_value);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a08451);
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<std::default_delete<duckdb::Constraint>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    paVar6 = &local_1d1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1d0,"Constraint not implemented!",paVar6);
    NotImplementedException::NotImplementedException((NotImplementedException *)paVar6,msg);
    __cxa_throw(msg,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case 4:
    TransformConstraint(in_stack_fffffffffffffec8,
                        (PGConstraint *)
                        CONCAT17(in_stack_fffffffffffffec7,
                                 CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
    break;
  case 5:
    LogicalIndex::LogicalIndex(local_48,in_R8);
    ColumnDefinition::GetName_abi_cxx11_(in_stack_fffffffffffffd58);
    local_69 = 1;
    make_uniq<duckdb::UniqueConstraint,duckdb::LogicalIndex,std::__cxx11::string,bool>
              ((LogicalIndex *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<duckdb::UniqueConstraint,std::default_delete<std::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>>>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>::
    ~unique_ptr((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                 *)0x1a08005);
    ::std::__cxx11::string::~string(local_68);
    break;
  case 6:
    LogicalIndex::LogicalIndex(local_90,in_R8);
    ColumnDefinition::GetName_abi_cxx11_(in_stack_fffffffffffffd58);
    make_uniq<duckdb::UniqueConstraint,duckdb::LogicalIndex,std::__cxx11::string,bool>
              ((LogicalIndex *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<duckdb::UniqueConstraint,std::default_delete<std::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>>>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>::
    ~unique_ptr((unique_ptr<duckdb::UniqueConstraint,_std::default_delete<duckdb::UniqueConstraint>,_true>
                 *)0x1a080c8);
    ::std::__cxx11::string::~string(local_b0);
    break;
  case 8:
    psVar3 = ColumnDefinition::Name_abi_cxx11_(in_RCX);
    optional_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ::optional_ptr(local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
    TransformForeignKeyConstraint(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<duckdb::ForeignKeyConstraint,std::default_delete<std::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>>>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,
               (unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>_>
                *)in_stack_fffffffffffffd58);
    unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
    ::~unique_ptr((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                   *)0x1a086d0);
    break;
  case 0xd:
    pcVar1 = *(char **)(in_RDX + 0xa0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_170,pcVar1,&local_171);
    compression_type = CompressionTypeFromString(in_stack_fffffffffffffda8);
    ColumnDefinition::SetCompressionType(in_RCX,compression_type);
    ::std::__cxx11::string::~string(local_170);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
    pCVar5 = ColumnDefinition::CompressionType(local_20);
    if (*pCVar5 == COMPRESSION_AUTO) {
      local_19a = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      paVar6 = &local_199;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_198,
                 "Unrecognized option for column compression, expected none, uncompressed, rle, dictionary, pfor, bitpacking or fsst"
                 ,paVar6);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->name);
      local_19a = 0;
      __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
    }
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<std::default_delete<duckdb::Constraint>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    break;
  case 0xe:
    local_18 = in_RDX;
    bVar2 = ColumnDefinition::HasDefaultValue(in_stack_fffffffffffffd58);
    if (bVar2) {
      local_101 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff28,
                 "\"%s\" has a DEFAULT value set, it can not become a GENERATED column",
                 (allocator *)&stack0xffffffffffffff27);
      psVar3 = ColumnDefinition::Name_abi_cxx11_(local_20);
      ::std::__cxx11::string::string(local_100,(string *)psVar3);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                ((InvalidInputException *)psVar3,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0
                );
      local_101 = 0;
      __cxa_throw(uVar4,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (local_118,*(PGNode **)(local_18 + 0x20));
    TransformExpression(in_stack_fffffffffffffd70,in_stack_fffffffffffffd78);
    ColumnDefinition::SetGeneratedExpression(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x1a082d3);
    unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
    unique_ptr<std::default_delete<duckdb::Constraint>,void>
              ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    break;
  case 0xf:
    uVar4 = __cxa_allocate_exception(0x10);
    paVar6 = (allocator *)&stack0xfffffffffffffec7;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffec8,"Can not create a STORED generated column!",paVar6
              );
    InvalidInputException::InvalidInputException
              (in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->name);
    __cxa_throw(uVar4,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (__uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>.
         super__Head_base<0UL,_duckdb::Constraint_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Constraint> Transformer::TransformConstraint(duckdb_libpgquery::PGConstraint &constraint,
                                                        ColumnDefinition &column, idx_t index) {
	switch (constraint.contype) {
	case duckdb_libpgquery::PG_CONSTR_NOTNULL:
		return make_uniq<NotNullConstraint>(LogicalIndex(index));
	case duckdb_libpgquery::PG_CONSTR_CHECK:
		return TransformConstraint(constraint);
	case duckdb_libpgquery::PG_CONSTR_PRIMARY:
		return make_uniq<UniqueConstraint>(LogicalIndex(index), column.GetName(), true);
	case duckdb_libpgquery::PG_CONSTR_UNIQUE:
		return make_uniq<UniqueConstraint>(LogicalIndex(index), column.GetName(), false);
	case duckdb_libpgquery::PG_CONSTR_NULL:
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_GENERATED_VIRTUAL: {
		if (column.HasDefaultValue()) {
			throw InvalidInputException("\"%s\" has a DEFAULT value set, it can not become a GENERATED column",
			                            column.Name());
		}
		column.SetGeneratedExpression(TransformExpression(constraint.raw_expr));
		return nullptr;
	}
	case duckdb_libpgquery::PG_CONSTR_GENERATED_STORED:
		throw InvalidInputException("Can not create a STORED generated column!");
	case duckdb_libpgquery::PG_CONSTR_DEFAULT:
		column.SetDefaultValue(TransformExpression(constraint.raw_expr));
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_COMPRESSION:
		column.SetCompressionType(CompressionTypeFromString(constraint.compression_name));
		if (column.CompressionType() == CompressionType::COMPRESSION_AUTO) {
			throw ParserException("Unrecognized option for column compression, expected none, uncompressed, rle, "
			                      "dictionary, pfor, bitpacking or fsst");
		}
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_FOREIGN:
		return TransformForeignKeyConstraint(constraint, &column.Name());
	default:
		throw NotImplementedException("Constraint not implemented!");
	}
}